

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

string * __thiscall
cmCoreTryCompile::WriteSource
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *filename,string *content,
          char *command)

{
  byte bVar1;
  char *pcVar2;
  cmAlphaNum local_480;
  cmAlphaNum local_450;
  string local_420;
  string *local_400;
  string *msg_2;
  cmAlphaNum local_3f0;
  cmAlphaNum local_3c0;
  string local_390;
  string *local_370;
  string *msg_1;
  ofstream file;
  cmAlphaNum local_138;
  undefined1 local_108 [8];
  string filepath;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  string local_78;
  string *local_58;
  string *msg;
  char *local_30;
  char *command_local;
  string *content_local;
  string *filename_local;
  cmCoreTryCompile *this_local;
  
  local_30 = command;
  command_local = (char *)content;
  content_local = filename;
  filename_local = &this->BinaryDirectory;
  this_local = (cmCoreTryCompile *)__return_storage_ptr__;
  cmsys::SystemTools::GetFilenamePath((string *)&msg,filename);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&msg);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_138,&this->BinaryDirectory);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&file.field_0x1f8,"/");
    cmStrCat<std::__cxx11::string>
              ((string *)local_108,&local_138,(cmAlphaNum *)&file.field_0x1f8,content_local);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(&msg_1,pcVar2,_S_out);
    bVar1 = std::ios::operator!((ios *)((long)&msg_1 + msg_1[-1]._M_string_length));
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&msg_1,(string *)command_local);
      bVar1 = std::ios::operator!((ios *)((long)&msg_1 + msg_1[-1]._M_string_length));
      if ((bVar1 & 1) == 0) {
        std::ofstream::close();
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_108);
        msg_2._4_4_ = 1;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_450,local_30);
        cmAlphaNum::cmAlphaNum(&local_480," failed to write \"");
        cmStrCat<std::__cxx11::string,char[2]>
                  (&local_420,&local_450,&local_480,content_local,(char (*) [2])0xd62232);
        local_400 = &local_420;
        cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,local_400);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        msg_2._4_4_ = 1;
        std::__cxx11::string::~string((string *)&local_420);
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_3c0,local_30);
      cmAlphaNum::cmAlphaNum(&local_3f0," failed to open \"");
      cmStrCat<std::__cxx11::string,char[14]>
                (&local_390,&local_3c0,&local_3f0,content_local,(char (*) [14])"\" for writing");
      local_370 = &local_390;
      cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,local_370);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      msg_2._4_4_ = 1;
      std::__cxx11::string::~string((string *)&local_390);
    }
    std::ofstream::~ofstream(&msg_1);
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_a8,local_30);
    cmAlphaNum::cmAlphaNum(&local_d8," given invalid filename \"");
    cmStrCat<std::__cxx11::string,char[2]>
              (&local_78,&local_a8,&local_d8,content_local,(char (*) [2])0xd62232);
    local_58 = &local_78;
    cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,&local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::WriteSource(std::string const& filename,
                                          std::string const& content,
                                          char const* command) const
{
  if (!cmSystemTools::GetFilenamePath(filename).empty()) {
    const auto& msg =
      cmStrCat(command, " given invalid filename \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  auto filepath = cmStrCat(this->BinaryDirectory, "/", filename);
  cmsys::ofstream file{ filepath.c_str(), std::ios::out };
  if (!file) {
    const auto& msg =
      cmStrCat(command, " failed to open \"", filename, "\" for writing");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file << content;
  if (!file) {
    const auto& msg = cmStrCat(command, " failed to write \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file.close();
  return filepath;
}